

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_usage(char *argv_0)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv_0);
  poVar1 = std::operator<<(poVar1," n_1 n_2 ... n_N\tSort {n_i}.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv_0);
  poVar1 = std::operator<<(poVar1," --stl_test\tTest stl-container sorting.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv_0);
  poVar1 = std::operator<<(poVar1," --test N max_size\tSort N lists of size less than max_size.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv_0);
  poVar1 = std::operator<<(poVar1,
                           " --resort N size\tSort nearly-ordered list of given size N times.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_usage(char *argv_0) {
	std::cout << "Usage: " << argv_0 << " n_1 n_2 ... n_N\tSort {n_i}." << std::endl;
	std::cout << "Usage: " << argv_0 << " --stl_test\tTest stl-container sorting." << std::endl;
	std::cout << "Usage: " << argv_0 << " --test N max_size\tSort N lists of size less than max_size." << std::endl;
	std::cout << "Usage: " << argv_0 << " --resort N size\tSort nearly-ordered list of given size N times." << std::endl;
}